

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConeRecord1.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::ConeRecord1::ConeRecord1
          (ConeRecord1 *this,KUINT8 Index,WorldCoordinates *VertexLocation,EulerAngles *Orientation,
          KFLOAT32 Height,KFLOAT32 PeakAngle)

{
  KFLOAT32 PeakAngle_local;
  KFLOAT32 Height_local;
  EulerAngles *Orientation_local;
  WorldCoordinates *VertexLocation_local;
  KUINT8 Index_local;
  ConeRecord1 *this_local;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__ConeRecord1_0033c8c0;
  WorldCoordinates::WorldCoordinates(&this->m_Loc,VertexLocation);
  EulerAngles::EulerAngles(&this->m_Ori,Orientation);
  this->m_f32Height = Height;
  this->m_f32PeakAngle = PeakAngle;
  this->m_ui32Padding = 0;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x300000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x180;
  return;
}

Assistant:

ConeRecord1::ConeRecord1( KUINT8 Index, const WorldCoordinates & VertexLocation, const EulerAngles & Orientation,
                          KFLOAT32 Height, KFLOAT32 PeakAngle ) :
    m_Loc( VertexLocation ),
    m_Ori( Orientation ),
    m_f32Height( Height ),
    m_f32PeakAngle( PeakAngle ),
    m_ui32Padding( 0 )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = ConeRecord1Type;
    m_ui16Length = ( CONE_RECORD_1_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}